

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.h
# Opt level: O0

void sse::common::zero<double>(double *pDst,int len)

{
  int len_local;
  double *pDst_local;
  __m128d a;
  int local_1fc;
  double *local_1f8;
  
  local_1f8 = pDst;
  for (local_1fc = len; 7 < local_1fc; local_1fc = local_1fc + -8) {
    *local_1f8 = 0.0;
    local_1f8[1] = 0.0;
    local_1f8[2] = 0.0;
    local_1f8[3] = 0.0;
    local_1f8[4] = 0.0;
    local_1f8[5] = 0.0;
    local_1f8[6] = 0.0;
    local_1f8[7] = 0.0;
    local_1f8 = local_1f8 + 8;
  }
  if (3 < local_1fc) {
    *local_1f8 = 0.0;
    local_1f8[1] = 0.0;
    local_1f8[2] = 0.0;
    local_1f8[3] = 0.0;
    local_1fc = local_1fc + -4;
    local_1f8 = local_1f8 + 4;
  }
  if (1 < local_1fc) {
    *local_1f8 = 0.0;
    local_1f8[1] = 0.0;
    local_1fc = local_1fc + -2;
    local_1f8 = local_1f8 + 2;
  }
  if (local_1fc != 0) {
    *local_1f8 = 0.0;
  }
  return;
}

Assistant:

_SIMD_SSE_T void zero(_T* pDst, int len)
        {
            set<_T>((_T)0, pDst, len);
        }